

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O3

CubicSplinePtr __thiscall OpenMD::EAM::getPhi(EAM *this,AtomType *atomType1,AtomType *atomType2)

{
  EAMMixingMethod EVar1;
  bool bVar2;
  double dVar3;
  EAMType EVar4;
  int iVar5;
  AtomType *in_RCX;
  ulong uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  pointer pEVar8;
  EAM *pEVar9;
  ulong uVar10;
  pointer pEVar11;
  int iVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  AtomType *pAVar15;
  RealType RVar16;
  RealType RVar17;
  AtomType *pAVar18;
  double dVar19;
  AtomType *pAVar20;
  CubicSplinePtr CVar21;
  EAMAdapter ea2;
  RealType phab;
  EAMAdapter ea1;
  RealType r;
  vector<double,_std::allocator<double>_> rvals;
  vector<double,_std::allocator<double>_> phivals_1;
  vector<double,_std::allocator<double>_> phivals;
  RealType r_1;
  CubicSplinePtr rho2;
  CubicSplinePtr rho1;
  double local_190;
  EAMAdapter local_180;
  double local_178;
  EAMAdapter local_170;
  RealType local_168;
  AtomType *local_160;
  RealType local_158;
  double local_150;
  EAM *local_148;
  AtomType *local_140;
  vector<double,_std::allocator<double>_> local_138;
  vector<double,_std::allocator<double>_> local_118;
  vector<double,_std::allocator<double>_> local_f8;
  EAMAdapter local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  double local_d0;
  double local_c8;
  EAM *local_c0;
  RealType local_b8;
  RealType local_b0;
  RealType local_a8;
  RealType local_a0;
  RealType local_98;
  RealType local_90;
  RealType local_88;
  RealType local_80;
  RealType local_78;
  RealType local_70;
  RealType local_68;
  RealType local_60;
  AtomType *local_58;
  EAMAdapter local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  EAMAdapter local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  (this->super_MetallicInteraction).super_NonBondedInteraction._vptr_NonBondedInteraction =
       (_func_int **)0x0;
  local_170.at_ = atomType2;
  local_148 = (EAM *)atomType1;
  local_c0 = this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::CubicSpline,std::allocator<OpenMD::CubicSpline>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->initialized_,(CubicSpline **)this,
             (allocator<OpenMD::CubicSpline> *)&local_138);
  local_178 = 0.0;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (double *)0x0;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  EVar4 = EAMAdapter::getEAMType(&local_170);
  if ((EVar4 == eamFuncfl) && (EVar4 = EAMAdapter::getEAMType(&local_180), EVar4 == eamFuncfl)) {
    EAMAdapter::getZSpline((EAMAdapter *)&local_118);
    EAMAdapter::getZSpline(&local_e0);
    EAMAdapter::getRhoSpline(&local_40);
    EAMAdapter::getRhoSpline(&local_50);
    RVar16 = EAMAdapter::getRcut(&local_170);
    iVar5 = EAMAdapter::getNr(&local_170);
    local_168 = EAMAdapter::getDr(&local_170);
    local_158 = EAMAdapter::getRcut(&local_180);
    iVar12 = EAMAdapter::getNr(&local_180);
    local_160 = (AtomType *)EAMAdapter::getDr(&local_180);
    local_140 = (AtomType *)EAMAdapter::getDr(&local_170);
    RVar17 = EAMAdapter::getDr(&local_180);
    uVar13 = SUB84(RVar17,0);
    uVar14 = (undefined4)((ulong)RVar17 >> 0x20);
    if (RVar16 <= 0.0) {
      RVar16 = 0.0;
    }
    dVar19 = local_168 * (double)iVar5;
    if (local_168 * (double)iVar5 <= RVar16) {
      dVar19 = RVar16;
    }
    RVar16 = local_158;
    if (local_158 <= dVar19) {
      RVar16 = dVar19;
    }
    dVar19 = (double)local_160 * (double)iVar12;
    if ((double)local_160 * (double)iVar12 <= RVar16) {
      dVar19 = RVar16;
    }
    if ((double)local_140 <= RVar17) {
      uVar13 = SUB84(local_140,0);
      uVar14 = (undefined4)((ulong)local_140 >> 0x20);
    }
    iVar5 = (int)(dVar19 / (double)CONCAT44(uVar14,uVar13) + 0.5);
    if (0 < iVar5) {
      iVar12 = 0;
      do {
        local_c8 = (double)iVar12 * (double)CONCAT44(uVar14,uVar13);
        if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_138,
                     (iterator)
                     local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_c8);
        }
        else {
          *local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_c8;
          local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        iVar12 = iVar12 + 1;
      } while (iVar5 != iVar12);
    }
    local_c8 = 0.0;
    if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish ==
        local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_f8,
                 (iterator)
                 local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_c8);
    }
    else {
      *local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish = 0.0;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    if (8 < (ulong)((long)local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start)) {
      uVar6 = 1;
      uVar10 = 2;
      do {
        local_168 = local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar6];
        local_150 = local_168;
        RVar16 = EAMAdapter::getRcut(&local_170);
        local_190 = 0.0;
        if (local_168 <= RVar16) {
          local_190 = CubicSpline::getValueAt((CubicSpline *)local_40.at_,&local_150);
        }
        local_158 = local_150;
        RVar16 = EAMAdapter::getRcut(&local_180);
        local_168 = 0.0;
        if (local_158 <= RVar16) {
          local_168 = CubicSpline::getValueAt((CubicSpline *)local_50.at_,&local_150);
        }
        local_158 = local_150;
        RVar16 = EAMAdapter::getRcut(&local_170);
        local_160 = (AtomType *)0x0;
        if (local_158 <= RVar16) {
          local_160 = (AtomType *)
                      CubicSpline::getValueAt
                                ((CubicSpline *)
                                 local_118.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start,&local_150);
        }
        local_158 = local_150;
        RVar16 = EAMAdapter::getRcut(&local_180);
        RVar17 = 0.0;
        if (local_158 <= RVar16) {
          RVar17 = CubicSpline::getValueAt((CubicSpline *)local_e0.at_,&local_150);
        }
        dVar19 = local_150;
        EVar1 = local_148->mixMeth_;
        if ((EVar1 - eamDream1 < 2) || (EVar1 == eamJohnson)) {
          local_178 = 0.0;
          if (0.0 < local_190) {
            local_178 = (local_168 / local_190) * 0.5 *
                        (((double)local_160 * (double)local_160 *
                         *(double *)&((_Rb_tree_header *)&local_148->pre11_)->_M_header) / local_150
                        ) + 0.0;
          }
          if (0.0 < local_168) {
            local_178 = (local_190 / local_168) * 0.5 *
                        ((RVar17 * RVar17 *
                         *(double *)&((_Rb_tree_header *)&local_148->pre11_)->_M_header) / local_150
                        ) + local_178;
          }
        }
        else if (EVar1 == eamDaw) {
          local_168 = RVar17;
          RVar16 = EAMAdapter::getRcut(&local_170);
          dVar3 = local_150;
          if ((RVar16 < dVar19) || (RVar16 = EAMAdapter::getRcut(&local_180), RVar16 < dVar3)) {
            local_178 = 0.0;
          }
          else {
            local_178 = ((double)local_160 * local_168 *
                        *(double *)&((_Rb_tree_header *)&local_148->pre11_)->_M_header) / local_150;
          }
        }
        else {
          builtin_strncpy(painCave.errMsg,
                          "EAM::getPhi hit a mixing method it doesn\'t know about!\n",0x38);
          painCave.isFatal = 1;
          painCave.severity = 1;
          simError();
        }
        if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_f8,
                     (iterator)
                     local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_178);
        }
        else {
          *local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_178;
          local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        bVar2 = uVar10 < (ulong)((long)local_138.super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_138.super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3);
        uVar6 = uVar10;
        uVar10 = (ulong)((int)uVar10 + 1);
      } while (bVar2);
    }
    pEVar9 = local_c0;
    CubicSpline::addPoints
              ((CubicSpline *)
               (local_c0->super_MetallicInteraction).super_NonBondedInteraction.
               _vptr_NonBondedInteraction,&local_138,&local_f8);
    _Var7._M_pi = extraout_RDX_03;
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      _Var7._M_pi = extraout_RDX_04;
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      _Var7._M_pi = extraout_RDX_05;
    }
    if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
      _Var7._M_pi = extraout_RDX_06;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      _Var7._M_pi = extraout_RDX_07;
    }
  }
  else {
    iVar5 = AtomType::getIdent(atomType2);
    pEVar9 = local_148;
    pEVar8 = (local_148->EAMdata).
             super__Vector_base<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>._M_impl.
             super__Vector_impl_data._M_start +
             *(int *)((long)&((AtomType *)
                             (local_148->EAMtids).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start)->_vptr_AtomType +
                     (long)iVar5 * 4);
    iVar5 = AtomType::getIdent(in_RCX);
    pEVar11 = (pEVar9->EAMdata).
              super__Vector_base<OpenMD::EAMAtomData,_std::allocator<OpenMD::EAMAtomData>_>._M_impl.
              super__Vector_impl_data._M_start +
              *(int *)((long)&((AtomType *)
                              (pEVar9->EAMtids).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start)->_vptr_AtomType +
                      (long)iVar5 * 4);
    local_168 = EAMAdapter::getRe(&local_170);
    local_60 = EAMAdapter::getA(&local_170);
    local_68 = EAMAdapter::getB(&local_170);
    local_70 = EAMAdapter::getAlpha(&local_170);
    local_78 = EAMAdapter::getBeta(&local_170);
    local_80 = EAMAdapter::getKappa(&local_170);
    local_88 = EAMAdapter::getLambda(&local_170);
    local_158 = EAMAdapter::getRe(&local_180);
    local_90 = EAMAdapter::getA(&local_180);
    local_98 = EAMAdapter::getB(&local_180);
    local_a0 = EAMAdapter::getAlpha(&local_180);
    local_a8 = EAMAdapter::getBeta(&local_180);
    local_b0 = EAMAdapter::getKappa(&local_180);
    local_b8 = EAMAdapter::getLambda(&local_180);
    local_140 = (AtomType *)pEVar8->rcut;
    local_160 = (AtomType *)pEVar11->rcut;
    pAVar20 = (AtomType *)local_148->eamRcut_;
    local_d0 = CubicSpline::getSpacing
                         ((CubicSpline *)
                          *(AtomType **)
                           &(pEVar8->rho).
                            super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>);
    RVar16 = CubicSpline::getSpacing
                       ((CubicSpline *)
                        *(AtomType **)
                         &(pEVar11->rho).
                          super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>);
    uVar13 = SUB84(RVar16,0);
    uVar14 = (undefined4)((ulong)RVar16 >> 0x20);
    pAVar18 = local_140;
    if ((double)local_140 <= 0.0) {
      pAVar18 = (AtomType *)0x0;
    }
    pAVar15 = local_160;
    if ((double)local_160 <= (double)pAVar18) {
      pAVar15 = pAVar18;
    }
    if ((double)pAVar20 <= (double)pAVar15) {
      pAVar20 = pAVar15;
    }
    if (local_d0 <= RVar16) {
      uVar13 = SUB84(local_d0,0);
      uVar14 = (undefined4)((ulong)local_d0 >> 0x20);
    }
    iVar5 = (int)((double)pAVar20 / (double)CONCAT44(uVar14,uVar13) + 1.0);
    if (0 < iVar5) {
      iVar12 = 0;
      do {
        local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((double)iVar12 * (double)CONCAT44(uVar14,uVar13));
        if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_138,
                     (iterator)
                     local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)&local_118);
        }
        else {
          *local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish =
               (double)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
          local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        iVar12 = iVar12 + 1;
      } while (iVar5 != iVar12);
    }
    pEVar9 = local_148;
    local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start) {
      uVar6 = 0;
      uVar10 = 1;
      do {
        local_e0.at_ = (AtomType *)
                       local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar6];
        local_178 = 0.0;
        pAVar20 = (AtomType *)0x0;
        RVar16 = 0.0;
        if ((double)local_e0.at_ < pEVar8->rcut) {
          RVar16 = CubicSpline::getValueAt
                             ((CubicSpline *)
                              *(AtomType **)
                               &(pEVar8->rho).
                                super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>,
                              (RealType *)&local_e0);
          local_140 = local_e0.at_;
          local_160 = (AtomType *)
                      PhiCoreCore(pEVar9,local_e0.at_,local_168,local_60,local_70,local_80);
          RVar17 = PhiCoreValence(pEVar9,(RealType)local_140,local_168,local_68,local_78,local_88);
          pAVar20 = (AtomType *)(RVar17 + (double)local_160);
        }
        dVar19 = 0.0;
        pAVar18 = (AtomType *)0x0;
        if ((double)local_e0.at_ < pEVar11->rcut) {
          local_160 = pAVar20;
          local_140 = (AtomType *)
                      CubicSpline::getValueAt
                                ((CubicSpline *)
                                 *(AtomType **)
                                  &(pEVar11->rho).
                                   super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>
                                 ,(RealType *)&local_e0);
          local_58 = local_e0.at_;
          local_d0 = PhiCoreCore(pEVar9,(RealType)local_e0.at_,local_158,local_90,local_a0,local_b0)
          ;
          RVar17 = PhiCoreValence(pEVar9,(RealType)local_58,local_158,local_98,local_a8,local_b8);
          dVar19 = RVar17 + local_d0;
          pAVar20 = local_160;
          pAVar18 = local_140;
        }
        if ((double)local_e0.at_ < pEVar8->rcut) {
          local_178 = ((double)pAVar18 / RVar16) * 0.5 * (double)pAVar20 + local_178;
        }
        if ((double)local_e0.at_ < pEVar11->rcut) {
          local_178 = (RVar16 / (double)pAVar18) * 0.5 * dVar19 + local_178;
        }
        if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)&local_118,
                     (iterator)
                     local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_178);
        }
        else {
          *local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = local_178;
          local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        bVar2 = uVar10 < (ulong)((long)local_138.super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_138.super__Vector_base<double,_std::allocator<double>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 3);
        uVar6 = uVar10;
        uVar10 = (ulong)((int)uVar10 + 1);
      } while (bVar2);
    }
    pEVar9 = local_c0;
    CubicSpline::addPoints
              ((CubicSpline *)
               (local_c0->super_MetallicInteraction).super_NonBondedInteraction.
               _vptr_NonBondedInteraction,&local_138,&local_118);
    _Var7._M_pi = extraout_RDX;
    if ((CubicSpline *)
        local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (CubicSpline *)0x0) {
      operator_delete(local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
      _Var7._M_pi = extraout_RDX_00;
    }
  }
  if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    _Var7._M_pi = extraout_RDX_01;
  }
  if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
    _Var7._M_pi = extraout_RDX_02;
  }
  CVar21.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var7._M_pi;
  CVar21.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pEVar9;
  return (CubicSplinePtr)CVar21.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CubicSplinePtr EAM::getPhi(AtomType* atomType1, AtomType* atomType2) {
    EAMAdapter ea1 = EAMAdapter(atomType1);
    EAMAdapter ea2 = EAMAdapter(atomType2);

    CubicSplinePtr cs {std::make_shared<CubicSpline>()};

    RealType rha(0.0), rhb(0.0), pha(0.0), phb(0.0), phab(0.0);
    vector<RealType> rvals;
    vector<RealType> phivals;
    RealType rmax(0.0), dr, r;
    int nr;

    if (ea1.getEAMType() == eamFuncfl && ea2.getEAMType() == eamFuncfl) {
      CubicSplinePtr z1   = ea1.getZSpline();
      CubicSplinePtr z2   = ea2.getZSpline();
      CubicSplinePtr rho1 = ea1.getRhoSpline();
      CubicSplinePtr rho2 = ea2.getRhoSpline();

      // make the r grid:

      // we need phi out to the largest value we'll encounter in the
      // radial space;

      rmax = max(rmax, ea1.getRcut());
      rmax = max(rmax, ea1.getNr() * ea1.getDr());

      rmax = max(rmax, ea2.getRcut());
      rmax = max(rmax, ea2.getNr() * ea2.getDr());

      // use the smallest dr (finest grid) to build our grid:

      dr = min(ea1.getDr(), ea2.getDr());
      nr = int(rmax / dr + 0.5);

      for (int i = 0; i < nr; i++)
        rvals.push_back(RealType(i * dr));

      // construct the pair potential:

      RealType za, zb;

      phivals.push_back(0.0);

      for (unsigned int i = 1; i < rvals.size(); i++) {
        r = rvals[i];

        // only use z(r) if we're inside this atom's cutoff radius,
        // otherwise, we'll use zero for the charge.  This effectively
        // means that our phi grid goes out beyond the cutoff of the
        // pair potential

        rha = r <= ea1.getRcut() ? rho1->getValueAt(r) : 0.0;
        rhb = r <= ea2.getRcut() ? rho2->getValueAt(r) : 0.0;

        za = r <= ea1.getRcut() ? z1->getValueAt(r) : 0.0;
        zb = r <= ea2.getRcut() ? z2->getValueAt(r) : 0.0;

        switch (mixMeth_) {
        case eamJohnson:
        case eamDream1:
        case eamDream2:
          phab = 0.0;
          if (rha > 0.0) {
            pha  = pre11_ * (za * za) / r;
            phab = phab + 0.5 * (rhb / rha) * pha;
          }
          if (rhb > 0.0) {
            phb  = pre11_ * (zb * zb) / r;
            phab = phab + 0.5 * (rha / rhb) * phb;
          }

          break;

        case eamDaw:
          if (r <= ea1.getRcut() && r <= ea2.getRcut()) {
            phab = pre11_ * (za * zb) / r;
          } else {
            phab = 0.0;
          }

          break;
        case eamUnknownMix:
        default:

          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "EAM::getPhi hit a mixing method it doesn't know about!\n");
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }
        phivals.push_back(phab);
      }
      cs->addPoints(rvals, phivals);
    } else {
      EAMAtomData& data1 = EAMdata[EAMtids[atomType1->getIdent()]];
      EAMAtomData& data2 = EAMdata[EAMtids[atomType2->getIdent()]];

      RealType re1, A1, B1, alpha1, beta1, kappa1, lambda1;
      RealType re2, A2, B2, alpha2, beta2, kappa2, lambda2;

      re1     = ea1.getRe();
      A1      = ea1.getA();
      B1      = ea1.getB();
      alpha1  = ea1.getAlpha();
      beta1   = ea1.getBeta();
      kappa1  = ea1.getKappa();
      lambda1 = ea1.getLambda();

      re2     = ea2.getRe();
      A2      = ea2.getA();
      B2      = ea2.getB();
      alpha2  = ea2.getAlpha();
      beta2   = ea2.getBeta();
      kappa2  = ea2.getKappa();
      lambda2 = ea2.getLambda();

      RealType rmax = 0.0;
      rmax          = max(rmax, data1.rcut);
      rmax          = max(rmax, data2.rcut);
      rmax          = max(rmax, eamRcut_);

      // use the smallest dr (finest grid) to build our grid:

      RealType dr = min(data1.rho->getSpacing(), data2.rho->getSpacing());

      int nr = int(rmax / dr + 1);

      for (int i = 0; i < nr; i++)
        rvals.push_back(RealType(i * dr));

      vector<RealType> phivals;
      RealType r;

      for (unsigned int i = 0; i < rvals.size(); i++) {
        r    = rvals[i];
        rha  = 0.0;
        rhb  = 0.0;
        pha  = 0.0;
        phb  = 0.0;
        phab = 0.0;

        // rcut values are derived parameters if no splines are pre-set:

        if (r < data1.rcut) {
          rha = data1.rho->getValueAt(r);

          // pha = ZhouPhi(r, re1, A1, B1, alpha1, beta1, kappa1, lambda1);
          pha = Phi(r, re1, A1, B1, alpha1, beta1, kappa1, lambda1);
        }
        if (r < data2.rcut) {
          rhb = data2.rho->getValueAt(r);
          // phb =  ZhouPhi(r, re2, A2, B2, alpha2, beta2, kappa2, lambda2);
          phb = Phi(r, re2, A2, B2, alpha2, beta2, kappa2, lambda2);
        }

        if (r < data1.rcut) phab = phab + 0.5 * (rhb / rha) * pha;
        if (r < data2.rcut) phab = phab + 0.5 * (rha / rhb) * phb;

        phivals.push_back(phab);
      }
      cs->addPoints(rvals, phivals);
    }

    return cs;
  }